

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_1::IsTypeNullable
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *instruction,
               ValidationState_t *_)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RAX;
  Instruction *pIVar4;
  ulong uVar5;
  uint16_t word_count;
  uint16_t opcode;
  uint16_t local_24;
  ushort local_22;
  
  local_22 = (ushort)((ulong)in_RAX >> 0x30);
  spvOpcodeSplit(*(instruction->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start,&local_24,&local_22);
  if (0x1140 < local_22) {
    if (local_22 == 0x1141) goto switchD_002d1073_caseD_20;
    if ((local_22 == 0x1168) || (local_22 == 0x14ee)) goto switchD_002d1073_caseD_17;
    goto switchD_002d1073_caseD_19;
  }
  bVar3 = true;
  switch(local_22) {
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
    break;
  case 0x17:
  case 0x18:
  case 0x1c:
switchD_002d1073_caseD_17:
    pIVar4 = ValidationState_t::FindDef
                       (_,(instruction->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start[2]);
    if (pIVar4 != (Instruction *)0x0) {
      bVar3 = IsTypeNullable(&pIVar4->words_,_);
      return bVar3;
    }
  default:
switchD_002d1073_caseD_19:
    bVar3 = false;
    break;
  case 0x1e:
    puVar1 = (instruction->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = (ulong)((long)(instruction->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1) < 9;
    if ((!bVar3) && (pIVar4 = ValidationState_t::FindDef(_,puVar1[2]), pIVar4 != (Instruction *)0x0)
       ) {
      uVar5 = 3;
      do {
        bVar2 = IsTypeNullable(&pIVar4->words_,_);
        if (!bVar2) {
          return bVar3;
        }
        puVar1 = (instruction->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        bVar3 = (ulong)((long)(instruction->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <=
                uVar5;
        if (bVar3) {
          return bVar3;
        }
        pIVar4 = ValidationState_t::FindDef(_,puVar1[uVar5]);
        uVar5 = uVar5 + 1;
      } while (pIVar4 != (Instruction *)0x0);
    }
    break;
  case 0x20:
switchD_002d1073_caseD_20:
    bVar3 = (instruction->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[2] != 0x14e5;
  }
  return bVar3;
}

Assistant:

bool IsTypeNullable(const std::vector<uint32_t>& instruction,
                    const ValidationState_t& _) {
  uint16_t opcode;
  uint16_t word_count;
  spvOpcodeSplit(instruction[0], &word_count, &opcode);
  switch (static_cast<spv::Op>(opcode)) {
    case spv::Op::OpTypeBool:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeEvent:
    case spv::Op::OpTypeDeviceEvent:
    case spv::Op::OpTypeReserveId:
    case spv::Op::OpTypeQueue:
      return true;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
    case spv::Op::OpTypeVector: {
      auto base_type = _.FindDef(instruction[2]);
      return base_type && IsTypeNullable(base_type->words(), _);
    }
    case spv::Op::OpTypeStruct: {
      for (size_t elementIndex = 2; elementIndex < instruction.size();
           ++elementIndex) {
        auto element = _.FindDef(instruction[elementIndex]);
        if (!element || !IsTypeNullable(element->words(), _)) return false;
      }
      return true;
    }
    case spv::Op::OpTypeUntypedPointerKHR:
    case spv::Op::OpTypePointer:
      if (spv::StorageClass(instruction[2]) ==
          spv::StorageClass::PhysicalStorageBuffer) {
        return false;
      }
      return true;
    default:
      return false;
  }
}